

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImDrawList::UpdateTextureID(ImDrawList *this)

{
  long lVar1;
  value_type *pvVar2;
  ImVec4 *pIVar3;
  ImTextureID pvVar4;
  undefined1 auVar5 [16];
  
  lVar1 = (long)(this->_TextureIdStack).Size;
  if (lVar1 == 0) {
    pvVar4 = (ImTextureID)0x0;
  }
  else {
    pvVar4 = (this->_TextureIdStack).Data[lVar1 + -1];
  }
  if ((this->CmdBuffer).Size != 0) {
    pvVar2 = ImVector<ImDrawCmd>::back(&this->CmdBuffer);
    if ((pvVar2->TextureId == pvVar4 || pvVar2->ElemCount == 0) &&
       (pvVar2->UserCallback == (ImDrawCallback)0x0)) {
      if ((1 < (this->CmdBuffer).Size) && (pvVar2[-1].TextureId == pvVar4)) {
        lVar1 = (long)(this->_ClipRectStack).Size;
        pIVar3 = &GNullClipRect;
        if (lVar1 != 0) {
          pIVar3 = (this->_ClipRectStack).Data + lVar1 + -1;
        }
        auVar5[0] = -(*(char *)&pvVar2[-1].ClipRect.x == *(char *)&pIVar3->x);
        auVar5[1] = -(*(char *)((long)&pvVar2[-1].ClipRect.x + 1) == *(char *)((long)&pIVar3->x + 1)
                     );
        auVar5[2] = -(*(char *)((long)&pvVar2[-1].ClipRect.x + 2) == *(char *)((long)&pIVar3->x + 2)
                     );
        auVar5[3] = -(*(char *)((long)&pvVar2[-1].ClipRect.x + 3) == *(char *)((long)&pIVar3->x + 3)
                     );
        auVar5[4] = -(*(char *)&pvVar2[-1].ClipRect.y == *(char *)&pIVar3->y);
        auVar5[5] = -(*(char *)((long)&pvVar2[-1].ClipRect.y + 1) == *(char *)((long)&pIVar3->y + 1)
                     );
        auVar5[6] = -(*(char *)((long)&pvVar2[-1].ClipRect.y + 2) == *(char *)((long)&pIVar3->y + 2)
                     );
        auVar5[7] = -(*(char *)((long)&pvVar2[-1].ClipRect.y + 3) == *(char *)((long)&pIVar3->y + 3)
                     );
        auVar5[8] = -(*(char *)&pvVar2[-1].ClipRect.z == *(char *)&pIVar3->z);
        auVar5[9] = -(*(char *)((long)&pvVar2[-1].ClipRect.z + 1) == *(char *)((long)&pIVar3->z + 1)
                     );
        auVar5[10] = -(*(char *)((long)&pvVar2[-1].ClipRect.z + 2) ==
                      *(char *)((long)&pIVar3->z + 2));
        auVar5[0xb] = -(*(char *)((long)&pvVar2[-1].ClipRect.z + 3) ==
                       *(char *)((long)&pIVar3->z + 3));
        auVar5[0xc] = -(*(char *)&pvVar2[-1].ClipRect.w == *(char *)&pIVar3->w);
        auVar5[0xd] = -(*(char *)((long)&pvVar2[-1].ClipRect.w + 1) ==
                       *(char *)((long)&pIVar3->w + 1));
        auVar5[0xe] = -(*(char *)((long)&pvVar2[-1].ClipRect.w + 2) ==
                       *(char *)((long)&pIVar3->w + 2));
        auVar5[0xf] = -(*(char *)((long)&pvVar2[-1].ClipRect.w + 3) ==
                       *(char *)((long)&pIVar3->w + 3));
        if (((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                     (ushort)(auVar5[0xf] >> 7) << 0xf) == 0xffff) &&
           (pvVar2[-1].UserCallback == (ImDrawCallback)0x0)) {
          ImVector<ImDrawCmd>::pop_back(&this->CmdBuffer);
          return;
        }
      }
      pvVar2->TextureId = pvVar4;
      return;
    }
  }
  AddDrawCmd(this);
  return;
}

Assistant:

void ImDrawList::UpdateTextureID()
{
    // If current command is used with different settings we need to add a new command
    const ImTextureID curr_texture_id = GetCurrentTextureId();
    ImDrawCmd* curr_cmd = CmdBuffer.Size ? &CmdBuffer.back() : NULL;
    if (!curr_cmd || (curr_cmd->ElemCount != 0 && curr_cmd->TextureId != curr_texture_id) || curr_cmd->UserCallback != NULL)
    {
        AddDrawCmd();
        return;
    }

    // Try to merge with previous command if it matches, else use current command
    ImDrawCmd* prev_cmd = CmdBuffer.Size > 1 ? curr_cmd - 1 : NULL;
    if (prev_cmd && prev_cmd->TextureId == curr_texture_id && memcmp(&prev_cmd->ClipRect, &GetCurrentClipRect(), sizeof(ImVec4)) == 0 && prev_cmd->UserCallback == NULL)
        CmdBuffer.pop_back();
    else
        curr_cmd->TextureId = curr_texture_id;
}